

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderOperatorTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Performance::anon_unknown_1::OperatorPerformanceCase::prepareProgram
          (OperatorPerformanceCase *this,int progNdx)

{
  int gridSizeY;
  code *pcVar1;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  reference this_00;
  reference pvVar6;
  size_type sVar7;
  reference pvVar8;
  reference spec;
  reference pvVar9;
  undefined8 uVar10;
  int local_114;
  int location;
  int attribNdx_1;
  vector<float,_std::allocator<float>_> vertices;
  value_type_conflict4 local_f0;
  int attribNdx;
  Vector<float,_4> local_dc;
  Vector<float,_4> local_cc;
  Vector<float,_4> local_b0;
  AttribSpec local_a0;
  undefined1 local_40 [8];
  vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
  attributes;
  ShaderProgram *program;
  Functions *gl;
  int progNdx_local;
  OperatorPerformanceCase *this_local;
  long lVar5;
  
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar3);
  this_00 = std::
            vector<de::SharedPtr<glu::ShaderProgram>,_std::allocator<de::SharedPtr<glu::ShaderProgram>_>_>
            ::operator[](&this->m_programs,(long)progNdx);
  attributes.
  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)de::SharedPtr<glu::ShaderProgram>::operator*(this_00);
  pvVar6 = std::
           vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext>_>
           ::operator[](&this->m_programData,(long)progNdx);
  std::
  vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
  ::vector((vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
            *)local_40,&pvVar6->attributes);
  tcu::Vector<float,_4>::Vector(&local_b0,-1.0,-1.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector(&local_cc,1.0,-1.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector(&local_dc,-1.0,1.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&attribNdx,1.0,1.0,0.0,1.0);
  AttribSpec::AttribSpec(&local_a0,"a_position",&local_b0,&local_cc,&local_dc,(Vec4 *)&attribNdx);
  std::
  vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
  ::push_back((vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
               *)local_40,&local_a0);
  AttribSpec::~AttribSpec(&local_a0);
  bVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty(&this->m_attribBuffers);
  if (!bVar2) {
    pcVar1 = *(code **)(lVar5 + 0x438);
    sVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->m_attribBuffers);
    pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->m_attribBuffers,0);
    (*pcVar1)(sVar7 & 0xffffffff,pvVar8);
  }
  sVar7 = std::
          vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
          ::size((vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
                  *)local_40);
  local_f0 = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&this->m_attribBuffers,sVar7,&local_f0);
  pcVar1 = *(code **)(lVar5 + 0x6c8);
  sVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->m_attribBuffers);
  pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (&this->m_attribBuffers,0);
  (*pcVar1)(sVar7 & 0xffffffff,pvVar8);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glGenBuffers()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/performance/es3pShaderOperatorTests.cpp"
                  ,0x286);
  vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  while( true ) {
    iVar3 = vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_;
    sVar7 = std::
            vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
            ::size((vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
                    *)local_40);
    if ((int)sVar7 <= iVar3) break;
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)&location);
    iVar3 = this->m_gridSizeX;
    gridSizeY = this->m_gridSizeY;
    spec = std::
           vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
           ::operator[]((vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
                         *)local_40,
                        (long)vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage._4_4_);
    generateVertices((vector<float,_std::allocator<float>_> *)&location,iVar3,gridSizeY,spec);
    pcVar1 = *(code **)(lVar5 + 0x40);
    pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->m_attribBuffers,
                        (long)vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage._4_4_);
    (*pcVar1)(0x8892,*pvVar8);
    pcVar1 = *(code **)(lVar5 + 0x150);
    sVar7 = std::vector<float,_std::allocator<float>_>::size
                      ((vector<float,_std::allocator<float>_> *)&location);
    pvVar9 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)&location,0);
    (*pcVar1)(0x8892,sVar7 << 2,pvVar9,0x88e4);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"Upload buffer data",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/performance/es3pShaderOperatorTests.cpp"
                    ,0x28f);
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)&location);
    vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ =
         vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage._4_4_ + 1;
  }
  local_114 = 0;
  while( true ) {
    sVar7 = std::
            vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
            ::size((vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
                    *)local_40);
    if ((int)sVar7 <= local_114) break;
    pcVar1 = *(code **)(lVar5 + 0x780);
    dVar4 = glu::ShaderProgram::getProgram
                      ((ShaderProgram *)
                       attributes.
                       super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
    ::operator[]((vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
                  *)local_40,(long)local_114);
    uVar10 = std::__cxx11::string::c_str();
    iVar3 = (*pcVar1)(dVar4,uVar10);
    if (-1 < iVar3) {
      (**(code **)(lVar5 + 0x610))(iVar3);
      pcVar1 = *(code **)(lVar5 + 0x40);
      pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->m_attribBuffers,(long)local_114);
      (*pcVar1)(0x8892,*pvVar8);
      (**(code **)(lVar5 + 0x19f0))(iVar3,4,0x1406,0,0,0);
    }
    local_114 = local_114 + 1;
  }
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"Setup vertex input state",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/performance/es3pShaderOperatorTests.cpp"
                  ,0x29e);
  pcVar1 = *(code **)(lVar5 + 0x1680);
  dVar4 = glu::ShaderProgram::getProgram
                    ((ShaderProgram *)
                     attributes.
                     super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  (*pcVar1)(dVar4);
  dVar4 = glu::ShaderProgram::getProgram
                    ((ShaderProgram *)
                     attributes.
                     super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  (*(this->super_TestCase).super_TestNode._vptr_TestNode[6])(this,(ulong)dVar4);
  (**(code **)(lVar5 + 0x1a00))(0,0,this->m_viewportWidth,this->m_viewportHeight);
  std::
  vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
  ::~vector((vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
             *)local_40);
  return;
}

Assistant:

void OperatorPerformanceCase::prepareProgram (int progNdx)
{
	DE_ASSERT(progNdx < (int)m_programs.size());
	DE_ASSERT(m_programData.size() == m_programs.size());

	const glw::Functions&	gl			= m_renderCtx.getFunctions();
	const ShaderProgram&	program		= *m_programs[progNdx];

	vector<AttribSpec>		attributes	= m_programData[progNdx].attributes;

	attributes.push_back(AttribSpec("a_position",
									Vec4(-1.0f, -1.0f, 0.0f, 1.0f),
									Vec4( 1.0f, -1.0f, 0.0f, 1.0f),
									Vec4(-1.0f,  1.0f, 0.0f, 1.0f),
									Vec4( 1.0f,  1.0f, 0.0f, 1.0f)));

	DE_ASSERT(program.isOk());

	// Generate vertices.
	if (!m_attribBuffers.empty())
		gl.deleteBuffers((glw::GLsizei)m_attribBuffers.size(), &m_attribBuffers[0]);
	m_attribBuffers.resize(attributes.size(), 0);
	gl.genBuffers((glw::GLsizei)m_attribBuffers.size(), &m_attribBuffers[0]);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers()");

	for (int attribNdx = 0; attribNdx < (int)attributes.size(); attribNdx++)
	{
		std::vector<float> vertices;
		generateVertices(vertices, m_gridSizeX, m_gridSizeY, attributes[attribNdx]);

		gl.bindBuffer(GL_ARRAY_BUFFER, m_attribBuffers[attribNdx]);
		gl.bufferData(GL_ARRAY_BUFFER, (glw::GLsizeiptr)(vertices.size()*sizeof(float)), &vertices[0], GL_STATIC_DRAW);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Upload buffer data");
	}

	// Setup attribute bindings.
	for (int attribNdx = 0; attribNdx < (int)attributes.size(); attribNdx++)
	{
		int location = gl.getAttribLocation(program.getProgram(), attributes[attribNdx].name.c_str());

		if (location >= 0)
		{
			gl.enableVertexAttribArray(location);
			gl.bindBuffer(GL_ARRAY_BUFFER, m_attribBuffers[attribNdx]);
			gl.vertexAttribPointer(location, 4, GL_FLOAT, GL_FALSE, 0, DE_NULL);
		}
	}
	GLU_EXPECT_NO_ERROR(gl.getError(), "Setup vertex input state");

	gl.useProgram(program.getProgram());
	setGeneralUniforms(program.getProgram());
	gl.viewport(0, 0, m_viewportWidth, m_viewportHeight);
}